

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O3

Rect __thiscall lunasvg::SVGTextElement::boundingBox(SVGTextElement *this,bool includeStroke)

{
  SVGTextPositioningElement *pSVar1;
  Rect RVar2;
  SVGTextFragment *fragment;
  pointer pSVar3;
  undefined8 uVar4;
  float fVar5;
  Rect boundingBox;
  Transform fragmentTranform;
  Rect local_a8;
  Transform local_98;
  pointer local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Rect local_58;
  Transform local_48;
  
  local_a8 = (Rect)(ZEXT816((ulong)0xbf800000bf800000) << 0x40);
  RVar2 = local_a8;
  pSVar3 = (this->m_fragments).
           super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->m_fragments).
             super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar3 == local_80) {
    local_a8.w = -1.0;
    local_a8.h = -1.0;
    uVar4 = local_a8._8_8_;
    local_a8 = RVar2;
  }
  else {
    do {
      pSVar1 = pSVar3->element;
      Transform::rotated(&local_98,pSVar3->angle,pSVar3->x,pSVar3->y);
      Transform::operator*(&local_48,&local_98,&pSVar3->lengthAdjustTransform);
      local_68 = ZEXT416((uint)pSVar3->x);
      local_78 = ZEXT416((uint)pSVar3->y);
      local_98.m_matrix.b = Font::ascent(&pSVar1->m_font);
      local_98.m_matrix.b = (float)local_78._0_4_ - local_98.m_matrix.b;
      local_98.m_matrix.c = pSVar3->width;
      local_98.m_matrix.d = (pSVar3->element->super_SVGGraphicsElement).super_SVGElement.m_font_size
      ;
      local_98.m_matrix.a = (float)local_68._0_4_;
      if (((includeStroke) && (0.0 < (pSVar1->m_stroke).m_opacity)) &&
         (((pSVar1->m_stroke).m_element != (SVGPaintElement *)0x0 ||
          (0xffffff < (pSVar1->m_stroke).m_color.m_value)))) {
        fVar5 = pSVar3->element->m_stroke_width * 0.5;
        local_98.m_matrix.a = (float)local_68._0_4_ - fVar5;
        local_98.m_matrix.b = local_98.m_matrix.b - fVar5;
        local_98.m_matrix.c = fVar5 + fVar5 + local_98.m_matrix.c;
        local_98.m_matrix.d = fVar5 + fVar5 + local_98.m_matrix.d;
      }
      local_58 = Transform::mapRect(&local_48,(Rect *)&local_98);
      local_a8 = Rect::united(&local_a8,&local_58);
      uVar4 = local_a8._8_8_;
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != local_80);
  }
  if (((float)uVar4 < 0.0) || (SUB84(uVar4,4) < 0.0)) {
    local_a8 = (Rect)ZEXT816(0);
  }
  return local_a8;
}

Assistant:

Rect SVGTextElement::boundingBox(bool includeStroke) const
{
    auto boundingBox = Rect::Invalid;
    for(const auto& fragment : m_fragments) {
        const auto& font = fragment.element->font();
        const auto& stroke = fragment.element->stroke();
        auto fragmentTranform = Transform::rotated(fragment.angle, fragment.x, fragment.y) * fragment.lengthAdjustTransform;
        auto fragmentRect = Rect(fragment.x, fragment.y - font.ascent(), fragment.width, fragment.element->font_size());
        if(includeStroke && stroke.isRenderable())
            fragmentRect.inflate(fragment.element->stroke_width() / 2.f);
        boundingBox.unite(fragmentTranform.mapRect(fragmentRect));
    }

    if(!boundingBox.isValid())
        boundingBox = Rect::Empty;
    return boundingBox;
}